

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int mt_flush_queue(BGZF *fp)

{
  int iVar1;
  bgzf_mtaux_t *pbVar2;
  worker_t *pwVar3;
  hFILE *fp_00;
  void *__src;
  undefined1 auVar4 [16];
  uint uVar5;
  int *piVar6;
  ulong __n;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong totalbytes;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  
  pbVar2 = fp->mt;
  pthread_mutex_lock((pthread_mutex_t *)&pbVar2->lock);
  auVar4 = _DAT_001567e0;
  iVar1 = pbVar2->n_threads;
  if (0 < (long)iVar1) {
    pwVar3 = pbVar2->w;
    lVar7 = (long)iVar1 + -1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar10 = auVar10 ^ _DAT_001567e0;
    auVar12 = _DAT_001567c0;
    auVar13 = _DAT_001567d0;
    do {
      auVar14 = auVar13 ^ auVar4;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar11 && auVar10._0_4_ < auVar14._0_4_ ||
                  iVar11 < auVar14._4_4_) & 1)) {
        *(undefined4 *)((long)&pwVar3->toproc + lVar7) = 1;
      }
      if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
          auVar14._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)&pwVar3[1].toproc + lVar7) = 1;
      }
      auVar14 = auVar12 ^ auVar4;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar14._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)&pwVar3[2].toproc + lVar7) = 1;
        *(undefined4 *)((long)&pwVar3[3].toproc + lVar7) = 1;
      }
      lVar8 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar8 + 4;
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar8 + 4;
      lVar7 = lVar7 + 0x80;
    } while ((ulong)(iVar1 + 3U >> 2) << 7 != lVar7);
  }
  pbVar2->proc_cnt = 0;
  pthread_cond_broadcast((pthread_cond_t *)&pbVar2->cv);
  pthread_mutex_unlock((pthread_mutex_t *)&pbVar2->lock);
  worker_aux(pbVar2->w);
  do {
  } while (pbVar2->proc_cnt < pbVar2->n_threads);
  if (0 < pbVar2->n_threads) {
    uVar5 = *(uint *)fp;
    lVar7 = 0x14;
    lVar8 = 0;
    do {
      uVar5 = uVar5 | *(ushort *)((long)&pbVar2->w->mt + lVar7);
      *(uint *)fp = uVar5;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (lVar8 < pbVar2->n_threads);
  }
  if (0 < pbVar2->curr) {
    piVar6 = pbVar2->len;
    lVar7 = 0;
    do {
      fp_00 = fp->fp;
      __src = pbVar2->blk[lVar7];
      totalbytes = (ulong)piVar6[lVar7];
      uVar9 = (long)fp_00->limit - (long)fp_00->begin;
      __n = totalbytes;
      if (uVar9 < totalbytes) {
        __n = uVar9;
      }
      memcpy(fp_00->begin,__src,__n);
      fp_00->begin = fp_00->begin + __n;
      if (uVar9 < totalbytes) {
        __n = hwrite2(fp_00,__src,totalbytes,__n);
      }
      piVar6 = pbVar2->len;
      if (__n != (long)piVar6[lVar7]) {
        *(byte *)fp = *(byte *)fp | 4;
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pbVar2->curr);
  }
  pbVar2->curr = 0;
  return -(uint)(*(short *)fp != 0);
}

Assistant:

static int mt_flush_queue(BGZF *fp)
{
    int i;
    mtaux_t *mt = fp->mt;
    // signal all the workers to compress
    pthread_mutex_lock(&mt->lock);
    for (i = 0; i < mt->n_threads; ++i) mt->w[i].toproc = 1;
    mt->proc_cnt = 0;
    pthread_cond_broadcast(&mt->cv);
    pthread_mutex_unlock(&mt->lock);
    // worker 0 is doing things here
    worker_aux(&mt->w[0]);
    // wait for all the threads to complete
    while (mt->proc_cnt < mt->n_threads);
    // dump data to disk
    for (i = 0; i < mt->n_threads; ++i) fp->errcode |= mt->w[i].errcode;
    for (i = 0; i < mt->curr; ++i)
        if (hwrite(fp->fp, mt->blk[i], mt->len[i]) != mt->len[i]) {
            fp->errcode |= BGZF_ERR_IO;
            break;
        }
    mt->curr = 0;
    return (fp->errcode == 0)? 0 : -1;
}